

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O1

int mem_close_comp(int handle)

{
  int iVar1;
  int status;
  size_t compsize;
  int local_14;
  size_t local_10;
  
  local_14 = 0;
  iVar1 = compress2file_from_mem
                    (memTable[handle].memaddr,memTable[handle].fitsfilesize,memTable[handle].fileptr
                     ,&local_10,&local_14);
  if (iVar1 != 0) {
    ffpmsg("failed to copy memory file to file (mem_close_comp)");
    local_14 = 0x6a;
  }
  free(memTable[handle].memaddr);
  memTable[handle].memaddrptr = (char **)0x0;
  memTable[handle].memaddr = (char *)0x0;
  if ((FILE *)memTable[handle].fileptr != _stdout) {
    fclose((FILE *)memTable[handle].fileptr);
  }
  return local_14;
}

Assistant:

int mem_close_comp(int handle)
/*
  compress the memory file, writing it out to the fileptr (which might
  be stdout)
*/
{
    int status = 0;
    size_t compsize;

    /* compress file in  memory to a .gz disk file */

    if(compress2file_from_mem(memTable[handle].memaddr,
              (size_t) (memTable[handle].fitsfilesize), 
              memTable[handle].fileptr,
              &compsize, &status ) )
    {
            ffpmsg("failed to copy memory file to file (mem_close_comp)");
            status = WRITE_ERROR;
    }

    free( memTable[handle].memaddr );   /* free the memory */
    memTable[handle].memaddrptr = 0;
    memTable[handle].memaddr = 0;

    /* close the compressed disk file (except if it is 'stdout' */
    if (memTable[handle].fileptr != stdout)
        fclose(memTable[handle].fileptr);

    return(status);
}